

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockCase.cpp
# Opt level: O3

IterateResult __thiscall deqp::UniformBlockCase::iterate(UniformBlockCase *this)

{
  ShaderInterface *this_00;
  pointer *pppSVar1;
  UniformBlock *pUVar2;
  _Alloc_hider __s;
  iterator __position;
  RenderContext *renderCtx;
  Context *pCVar3;
  mapped_type pvVar4;
  ContextInfo *pCVar5;
  code *pcVar6;
  void *pvVar7;
  pointer piVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  pointer puVar11;
  pointer pcVar12;
  int iVar13;
  DataType DVar14;
  deUint32 dVar15;
  deBool dVar16;
  deUint32 dVar17;
  DataType DVar18;
  undefined4 extraout_var;
  long *plVar19;
  ulong uVar20;
  pointer pBVar21;
  mapped_type *ppvVar22;
  pointer pBVar23;
  pointer pBVar24;
  char *pcVar25;
  size_t sVar26;
  pointer ppUVar27;
  mapped_type_conflict *pmVar28;
  TestError *this_01;
  uint uVar29;
  int iVar30;
  int iVar31;
  _func_int **pp_Var32;
  long *plVar33;
  pointer ppUVar34;
  pointer pBVar35;
  deUint32 binding;
  pointer pUVar36;
  deUint32 binding_1;
  ulong uVar37;
  pointer pBVar38;
  long lVar39;
  undefined1 isVertex;
  uint uVar40;
  ulong in_R9;
  pointer pUVar41;
  long lVar42;
  undefined1 auVar43 [8];
  pointer pBVar44;
  bool bVar45;
  bool bVar46;
  int numActiveUniforms;
  int curOffset;
  UniformBufferManager bufferManager;
  int numActiveBlocks;
  UniformLayout glLayout;
  int nameLen;
  int numBlockUniforms;
  deUint32 type;
  int size_1;
  GLsizei nameLen_1;
  UniformLayout refLayout;
  Random rnd;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<char,_std::allocator<char>_> nameBuf_1;
  vector<int,_std::allocator<int>_> blockIndices;
  vector<int,_std::allocator<int>_> rowMajorFlags;
  vector<int,_std::allocator<int>_> matrixStrides;
  vector<int,_std::allocator<int>_> arrayStrides;
  vector<int,_std::allocator<int>_> offsets;
  map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> blockPointers;
  ostringstream vtxSrc;
  ShaderProgram program;
  ostringstream fragSrc;
  char *local_7e8 [2];
  int local_7d4;
  UniformBlockCase *local_7d0;
  long local_7c8;
  UniformBlock *local_7c0;
  undefined1 local_7b8 [32];
  _Base_ptr local_798;
  size_t local_790;
  int local_784;
  value_type local_780;
  int local_75c;
  undefined1 local_758 [24];
  vector<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_> vStack_740;
  TestLog *local_720;
  vector<int,_std::allocator<int>_> local_718;
  ulong local_6f8;
  vector<int,_std::allocator<int>_> local_6f0;
  int local_6d4;
  int local_6d0;
  int local_6cc;
  UniformLayout local_6c8;
  pointer local_698;
  ulong local_690;
  ulong local_688;
  ulong local_680;
  ulong local_678;
  long local_670;
  undefined1 local_668 [8];
  undefined1 auStack_660 [8];
  undefined1 local_658 [16];
  _Alloc_hider local_648;
  pointer local_640;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_638 [4];
  ios_base local_5f8 [8];
  ios_base local_5f0 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_5d8;
  undefined1 local_5b8 [208];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_4e8;
  vector<char,_std::allocator<char>_> local_4d0;
  vector<int,_std::allocator<int>_> local_4b8;
  vector<int,_std::allocator<int>_> local_4a0;
  vector<int,_std::allocator<int>_> local_488;
  vector<int,_std::allocator<int>_> local_470;
  vector<int,_std::allocator<int>_> local_458;
  ulong local_440;
  long local_438;
  ulong local_430;
  pointer local_428;
  undefined1 local_420 [16];
  pointer local_410;
  pointer local_408;
  pointer local_400;
  pointer local_3f8;
  undefined1 local_3f0 [16];
  _func_int *local_3e0;
  long lStack_3d8;
  ios_base local_380 [264];
  ShaderProgram local_278;
  undefined1 local_1a8 [16];
  _func_int *local_198;
  long lStack_190;
  ios_base local_138 [264];
  
  local_720 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar13 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_7c8 = CONCAT44(extraout_var,iVar13);
  local_6c8.uniforms.
  super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6c8.uniforms.
  super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6c8.blocks.
  super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6c8.uniforms.
  super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8.blocks.
  super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8.blocks.
  super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_408 = (pointer)(local_420 + 8);
  local_420._8_4_ = _S_red;
  local_410 = (pointer)0x0;
  local_3f8 = (pointer)0x0;
  local_7d0 = this;
  local_400 = local_408;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  local_6f8 = (ulong)((long)(local_7d0->m_interface).m_uniformBlocks.
                            super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(local_7d0->m_interface).m_uniformBlocks.
                           super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3;
  if (0 < (int)(uint)local_6f8) {
    pppSVar1 = &local_278.m_shaders[0].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    local_6f8 = (ulong)((uint)local_6f8 & 0x7fffffff);
    uVar37 = 0;
    do {
      pUVar2 = (local_7d0->m_interface).m_uniformBlocks.
               super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar37];
      local_678 = uVar37;
      if (((pUVar2->m_instanceName)._M_string_length == 0) ||
         ((pUVar2->m_instanceName)._M_dataplus._M_p == (pointer)0x0)) {
        local_3f0._0_8_ = &local_3e0;
        local_3f0._8_8_ = 0;
        local_3e0 = (_func_int *)((ulong)local_3e0 & 0xffffffffffffff00);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_668,(pUVar2->m_blockName)._M_dataplus._M_p,
                   (allocator<char> *)local_1a8);
        plVar19 = (long *)std::__cxx11::string::append((char *)local_668);
        local_3f0._0_8_ = &local_3e0;
        pp_Var32 = (_func_int **)(plVar19 + 2);
        if ((_func_int **)*plVar19 == pp_Var32) {
          local_3e0 = *pp_Var32;
          lStack_3d8 = plVar19[3];
        }
        else {
          local_3e0 = *pp_Var32;
          local_3f0._0_8_ = (_func_int **)*plVar19;
        }
        local_3f0._8_8_ = plVar19[1];
        *plVar19 = (long)pp_Var32;
        plVar19[1] = 0;
        *(undefined1 *)(plVar19 + 2) = 0;
        if (local_668 != (undefined1  [8])(auStack_660 + 8)) {
          operator_delete((void *)local_668,local_658._0_8_ + 1);
        }
      }
      local_7b8._0_8_ = local_7b8._0_8_ & 0xffffffff00000000;
      uVar37 = (ulong)((long)local_6c8.uniforms.
                             super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_6c8.uniforms.
                            super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 6;
      pUVar36 = (pUVar2->m_uniforms).
                super__Vector_base<deqp::ub::Uniform,_std::allocator<deqp::ub::Uniform>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_784 = 0;
      local_698 = (pointer)((ulong)local_698 & 0xffffffff00000000);
      local_7c0 = pUVar2;
      local_690 = uVar37;
      if (pUVar36 !=
          (pUVar2->m_uniforms).
          super__Vector_base<deqp::ub::Uniform,_std::allocator<deqp::ub::Uniform>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        uVar37 = (long)local_6c8.blocks.
                       super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_6c8.blocks.
                       super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_668 = (undefined1  [8])(auStack_660 + 8);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_668,local_3f0._0_8_,local_3f0._8_8_ + local_3f0._0_8_);
          std::__cxx11::string::append((char *)local_668);
          uVar40 = pUVar36->m_flags;
          uVar29 = uVar40;
          if ((uVar40 & 0x38) == 0) {
            uVar29 = local_7c0->m_flags;
          }
          if ((uVar40 & 0xc0) == 0) {
            uVar40 = local_7c0->m_flags;
          }
          uVar40 = uVar40 & 0xc0 | uVar29 & 0x38;
          in_R9 = (ulong)uVar40;
          ub::anon_unknown_1::computeStd140Layout
                    (&local_6c8,(int *)local_7b8,(int)(uVar37 >> 6),(string *)local_668,
                     &pUVar36->m_type,uVar40);
          if (local_668 != (undefined1  [8])(auStack_660 + 8)) {
            operator_delete((void *)local_668,local_658._0_8_ + 1);
          }
          pUVar36 = pUVar36 + 1;
        } while (pUVar36 !=
                 (local_7c0->m_uniforms).
                 super__Vector_base<deqp::ub::Uniform,_std::allocator<deqp::ub::Uniform>_>._M_impl.
                 super__Vector_impl_data._M_finish);
        local_698 = (pointer)CONCAT44(local_698._4_4_,local_7b8._0_4_);
        uVar37 = (ulong)((long)local_6c8.uniforms.
                               super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_6c8.uniforms.
                              super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 6;
      }
      iVar13 = local_7c0->m_arraySize;
      if (local_7c0->m_arraySize < 2) {
        iVar13 = 1;
      }
      local_670 = CONCAT44(local_670._4_4_,iVar13);
      do {
        local_668 = (undefined1  [8])(auStack_660 + 8);
        auStack_660 = (undefined1  [8])0x0;
        local_658._0_8_ = local_658._0_8_ & 0xffffffffffffff00;
        local_648._M_p = local_648._M_p & 0xffffffff00000000;
        aaStack_638[0]._8_8_ = (pointer)0x0;
        local_640 = (pointer)0x0;
        aaStack_638[0]._M_allocated_capacity = (pointer)0x0;
        std::vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>::
        emplace_back<deqp::ub::BlockLayoutEntry>(&local_6c8.blocks,(BlockLayoutEntry *)local_668);
        if (local_640 != (pointer)0x0) {
          operator_delete(local_640,aaStack_638[0]._8_8_ - (long)local_640);
        }
        if (local_668 != (undefined1  [8])(auStack_660 + 8)) {
          operator_delete((void *)local_668,local_658._0_8_ + 1);
        }
        pBVar24 = local_6c8.blocks.
                  super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pBVar21 = local_6c8.blocks.
                  super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -1;
        __s._M_p = (local_7c0->m_blockName)._M_dataplus._M_p;
        pcVar25 = (char *)local_6c8.blocks.
                          super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-1].name._M_string_length;
        strlen(__s._M_p);
        std::__cxx11::string::_M_replace((ulong)pBVar21,0,pcVar25,(ulong)__s._M_p);
        pBVar24[-1].size = (int)local_698;
        local_668._0_4_ = (int)local_690;
        if ((int)local_690 < (int)uVar37) {
          uVar20 = local_690;
          do {
            __position._M_current =
                 pBVar24[-1].activeUniformIndices.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                pBVar24[-1].activeUniformIndices.super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&pBVar24[-1].activeUniformIndices,
                         __position,(int *)local_668);
            }
            else {
              *__position._M_current = (int)uVar20;
              pBVar24[-1].activeUniformIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl
              .super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            uVar40 = local_668._0_4_ + 1;
            uVar20 = (ulong)uVar40;
            local_668._0_4_ = uVar40;
          } while ((int)uVar40 < (int)uVar37);
        }
        if (0 < local_7c0->m_arraySize) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_668);
          std::ostream::operator<<((ostringstream *)local_668,local_784);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_668);
          std::ios_base::~ios_base(local_5f8);
          plVar19 = (long *)std::__cxx11::string::replace((ulong)local_758,0,(char *)0x0,0x1c8561e);
          plVar33 = plVar19 + 2;
          if ((pointer *)*plVar19 == (pointer *)plVar33) {
            local_278.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar33;
            local_278.m_shaders[1].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar19[3];
            local_278.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)pppSVar1;
          }
          else {
            local_278.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar33;
            local_278.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar19;
          }
          local_278.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)plVar19[1];
          *plVar19 = (long)plVar33;
          plVar19[1] = 0;
          *(undefined1 *)(plVar19 + 2) = 0;
          plVar19 = (long *)std::__cxx11::string::append((char *)&local_278);
          pp_Var32 = (_func_int **)(plVar19 + 2);
          if ((_func_int **)*plVar19 == pp_Var32) {
            local_198 = *pp_Var32;
            lStack_190 = plVar19[3];
            local_1a8._0_8_ = &local_198;
          }
          else {
            local_198 = *pp_Var32;
            local_1a8._0_8_ = (_func_int **)*plVar19;
          }
          local_1a8._8_8_ = plVar19[1];
          *plVar19 = (long)pp_Var32;
          plVar19[1] = 0;
          *(undefined1 *)(plVar19 + 2) = 0;
          std::__cxx11::string::_M_append((char *)pBVar21,local_1a8._0_8_);
          if ((_func_int **)local_1a8._0_8_ != &local_198) {
            operator_delete((void *)local_1a8._0_8_,(ulong)(local_198 + 1));
          }
          if (local_278.m_shaders[0].
              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)pppSVar1) {
            operator_delete(local_278.m_shaders[0].
                            super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_278.m_shaders[0].
                                  super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
          }
          if ((undefined1 *)local_758._0_8_ != local_758 + 0x10) {
            operator_delete((void *)local_758._0_8_,local_758._16_8_ + 1);
          }
        }
        local_784 = local_784 + 1;
      } while (local_784 != (int)local_670);
      if ((_func_int **)local_3f0._0_8_ != &local_3e0) {
        operator_delete((void *)local_3f0._0_8_,(ulong)(local_3e0 + 1));
      }
      uVar37 = local_678 + 1;
    } while (uVar37 != local_6f8);
  }
  uVar37 = 0;
  pBVar21 = local_6c8.blocks.
            super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_6c8.blocks.
      super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_6c8.blocks.
      super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      uVar40 = (int)uVar37 + pBVar21->size;
      uVar37 = (ulong)uVar40;
      pBVar21 = pBVar21 + 1;
    } while (pBVar21 !=
             local_6c8.blocks.
             super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    uVar37 = (ulong)(int)uVar40;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_4e8,uVar37);
  local_668 = (undefined1  [8])((ulong)local_668 & 0xffffffff00000000);
  if (0 < (int)((ulong)((long)local_6c8.blocks.
                              super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_6c8.blocks.
                             super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 6)) {
    iVar13 = 0;
    do {
      puVar11 = local_4e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppvVar22 = std::
                 map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>::
                 operator[]((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                             *)local_420,(key_type_conflict *)local_668);
      *ppvVar22 = puVar11 + iVar13;
      iVar30 = local_668._0_4_ + 1;
      iVar13 = iVar13 + local_6c8.blocks.
                        super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start[(int)local_668._0_4_].size;
      local_668._0_4_ = iVar30;
    } while (iVar30 < (int)((ulong)((long)local_6c8.blocks.
                                          super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_6c8.blocks.
                                         super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 6));
  }
  deRandom_init((deRandom *)local_668,1);
  local_688 = (ulong)((long)local_6c8.blocks.
                            super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_6c8.blocks.
                           super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 6;
  if (0 < (int)(uint)local_688) {
    local_688 = (ulong)((uint)local_688 & 0x7fffffff);
    in_R9 = 0;
    do {
      pBVar44 = (pointer)(local_420 + 8);
      pBVar24 = pBVar44;
      pBVar38 = pBVar44;
      pBVar21 = local_410;
      if (local_410 != (pointer)0x0) {
        do {
          pBVar35 = pBVar21;
          pBVar23 = pBVar24;
          lVar39 = (long)pBVar35->size;
          pBVar24 = pBVar35;
          if (lVar39 < (long)in_R9) {
            pBVar24 = pBVar23;
          }
          pBVar21 = *(pointer *)((long)&(pBVar35->name).field_2 + (ulong)(lVar39 < (long)in_R9) * 8)
          ;
        } while (pBVar21 != (pointer)0x0);
        if (pBVar24 != pBVar44) {
          if (lVar39 < (long)in_R9) {
            pBVar35 = pBVar23;
          }
          pBVar38 = pBVar24;
          if ((long)in_R9 < (long)pBVar35->size) {
            pBVar38 = pBVar44;
          }
        }
      }
      local_440 = in_R9;
      local_438 = in_R9 * 0x40;
      local_680 = (ulong)((long)local_6c8.blocks.
                                super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                                ._M_impl.super__Vector_impl_data._M_start[in_R9].
                                activeUniformIndices.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_6c8.blocks.
                               super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                               ._M_impl.super__Vector_impl_data._M_start[in_R9].activeUniformIndices
                               .super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2;
      uVar40 = (uint)local_680;
      if (0 < (int)uVar40) {
        local_428 = (pBVar38->activeUniformIndices).super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        local_680 = (ulong)(uVar40 & 0x7fffffff);
        uVar37 = 0;
        do {
          pUVar41 = local_6c8.uniforms.
                    super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          iVar13 = *(int *)(*(long *)((long)&((local_6c8.blocks.
                                               super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             activeUniformIndices).
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start + local_438) +
                           uVar37 * 4);
          DVar14 = glu::getDataTypeScalarType
                             (local_6c8.uniforms.
                              super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                              ._M_impl.super__Vector_impl_data._M_start[iVar13].type);
          pUVar41 = pUVar41 + iVar13;
          iVar13 = glu::getDataTypeScalarSize(pUVar41->type);
          DVar18 = pUVar41->type;
          bVar45 = DVar18 - TYPE_FLOAT_MAT2 < 9;
          bVar46 = DVar18 - TYPE_DOUBLE_MAT2 < 9;
          local_7c0 = (UniformBlock *)CONCAT44(local_7c0._4_4_,1);
          local_784 = CONCAT31(local_784._1_3_,bVar46 || bVar45);
          if (bVar46 || bVar45) {
            if (pUVar41->isRowMajor == true) {
              iVar30 = glu::getDataTypeMatrixNumRows(DVar18);
              local_7c0 = (UniformBlock *)CONCAT44(local_7c0._4_4_,iVar30);
            }
            else {
              iVar30 = glu::getDataTypeMatrixNumColumns(DVar18);
              local_7c0 = (UniformBlock *)CONCAT44(local_7c0._4_4_,iVar30);
            }
          }
          local_430 = uVar37;
          iVar30 = pUVar41->size;
          local_6f8 = CONCAT44(local_6f8._4_4_,iVar30);
          if (0 < iVar30) {
            uVar37 = (long)iVar13 / (long)(int)local_7c0 & 0xffffffff;
            local_690 = uVar37;
            iVar13 = 0;
            local_698 = pUVar41;
            do {
              iVar31 = pUVar41->arrayStride * iVar13;
              if ((int)local_6f8 < 2) {
                iVar31 = 0;
              }
              if (0 < (int)local_7c0) {
                local_678 = CONCAT44(local_678._4_4_,iVar13);
                local_670 = (long)local_428 + (long)iVar31 + (long)pUVar41->offset;
                iVar13 = 0;
                do {
                  lVar39 = (long)(pUVar41->matrixStride * iVar13);
                  if ((char)local_784 == '\0') {
                    lVar39 = 0;
                  }
                  if (0 < (int)local_690) {
                    lVar39 = lVar39 + local_670;
                    lVar42 = 0;
                    do {
                      if ((int)DVar14 < 0x1f) {
                        if (DVar14 == TYPE_FLOAT) {
                          dVar15 = deRandom_getUint32((deRandom *)local_668);
                          *(float *)(lVar39 + (int)lVar42) = (float)(int)(dVar15 % 0x13 - 9);
                        }
                        else if (DVar14 == TYPE_INT) {
                          dVar15 = deRandom_getUint32((deRandom *)local_668);
                          uVar40 = dVar15 % 0x13 - 9;
                          goto LAB_00dd7844;
                        }
                      }
                      else {
                        if (DVar14 == TYPE_UINT) {
                          dVar15 = deRandom_getUint32((deRandom *)local_668);
                          uVar40 = dVar15 % 10;
                        }
                        else {
                          if (DVar14 != TYPE_BOOL) goto LAB_00dd7849;
                          dVar16 = deRandom_getBool((deRandom *)local_668);
                          uVar40 = 0;
                          if (dVar16 == 1) {
                            dVar15 = deRandom_getUint32((deRandom *)local_668);
                            uVar40 = dVar15 | 1;
                          }
                        }
LAB_00dd7844:
                        *(uint *)(lVar39 + (int)lVar42) = uVar40;
                      }
LAB_00dd7849:
                      lVar42 = lVar42 + 4;
                    } while (uVar37 * 4 - lVar42 != 0);
                  }
                  iVar13 = iVar13 + 1;
                  pUVar41 = local_698;
                } while (iVar13 != (int)local_7c0);
                iVar30 = local_698->size;
                iVar13 = (int)local_678;
              }
              iVar13 = iVar13 + 1;
            } while (iVar13 < iVar30);
          }
          uVar37 = local_430 + 1;
        } while (uVar37 != local_680);
      }
      in_R9 = local_440 + 1;
    } while (in_R9 != local_688);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pcVar25 = glu::getGLSLVersionDeclaration(local_7d0->m_glslVersion);
  if (pcVar25 == (char *)0x0) {
    std::ios::clear((int)local_7e8 + (int)*(_func_int **)(local_3f0._0_8_ + -0x18) + 0x3f8);
  }
  else {
    sVar26 = strlen(pcVar25);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,pcVar25,sVar26);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3f0,"in highp vec4 a_position;\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3f0,"out mediump float v_vtxResult;\n",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,"\n",1);
  this_00 = &local_7d0->m_interface;
  local_668 = (undefined1  [8])0x0;
  auStack_660 = (undefined1  [8])0x0;
  local_658._0_8_ = 0;
  ub::ShaderInterface::getNamedStructs
            (this_00,(vector<const_deqp::ub::StructType_*,_std::allocator<const_deqp::ub::StructType_*>_>
                      *)local_668);
  if (local_668 != auStack_660) {
    auVar43 = local_668;
    do {
      ub::anon_unknown_1::generateFullDeclaration
                ((ostringstream *)local_3f0,*(StructType **)auVar43,0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,";\n",2);
      auVar43 = (undefined1  [8])((long)auVar43 + 8);
    } while (auVar43 != auStack_660);
  }
  ppUVar27 = (local_7d0->m_interface).m_uniformBlocks.
             super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppUVar34 = (local_7d0->m_interface).m_uniformBlocks.
             super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppUVar34 - (long)ppUVar27) >> 3)) {
    lVar39 = 0;
    do {
      if ((ppUVar27[lVar39]->m_flags & 0x100) != 0) {
        ub::anon_unknown_1::generateDeclaration((ostringstream *)local_3f0,ppUVar27[lVar39]);
        ppUVar27 = (local_7d0->m_interface).m_uniformBlocks.
                   super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppUVar34 = (local_7d0->m_interface).m_uniformBlocks.
                   super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      }
      lVar39 = lVar39 + 1;
    } while (lVar39 < (int)((ulong)((long)ppUVar34 - (long)ppUVar27) >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3f0,
             "mediump float compare_float    (highp float a, highp float b)  { return abs(a - b) < 0.05 ? 1.0 : 0.0; }\nmediump float compare_vec2     (highp vec2 a, highp vec2 b)    { return compare_float(a.x, b.x)*compare_float(a.y, b.y); }\nmediump float compare_vec3     (highp vec3 a, highp vec3 b)    { return compare_float(a.x, b.x)*compare_float(a.y, b.y)*compare_float(a.z, b.z); }\nmediump float compare_vec4     (highp vec4 a, highp vec4 b)    { return compare_float(a.x, b.x)*compare_float(a.y, b.y)*compare_float(a.z, b.z)*compare_float(a.w, b.w); }\nmediump float compare_mat2     (highp mat2 a, highp mat2 b)    { return compare_vec2(a[0], b[0])*compare_vec2(a[1], b[1]); }\nmediump float compare_mat2x3   (highp mat2x3 a, highp mat2x3 b){ return compare_vec3(a[0], b[0])*compare_vec3(a[1], b[1]); }\nmediump float compare_mat2x4   (highp mat2x4 a, highp mat2x4 b){ return compare_vec4(a[0], b[0])*compare_vec4(a[1], b[1]); }\nmediump float compare_mat3x2   (highp mat3x2 a, highp mat3x2 b){ return compare_vec2(a[0], b[0])*compare_vec2(a[1], b[1])*compare_vec2(a[2], b[2]); }\nmediump float compare_mat3     (highp mat3 a, highp mat3 b)    { return compare_vec3(a[0], b[0])*compare_vec3(a[1], b[1])*compare_vec3(a[2], b[2]); }\nmediump float compare_mat3x4   (highp mat3x4 a, highp mat3x4 b){ return compare_vec4(a[0], b[0])*compare_vec4(a[1], b[1])*compare_vec4(a[2], b[2]); }\nmediump float compare_mat4x2   (highp mat4x2 a, highp mat4x2 b){ return compare_vec2(a[0], b[0])*compare_vec2(a[1], b[1])*compare_vec2(a[2], b[2])*compare_vec2(a[3], b[3]); }\nmediump float compare_mat4x3   (highp mat4x3 a, highp mat4x3 b){ return compare_vec3(a[0], b[0])*compare_vec3(a[1], b[1])*compare_vec3(a[2], b[2])*compare_vec3(a[3], b[3]); }\nmediump float compare_mat4     (highp mat4 a, highp mat4 b)    { return compare_vec4(a[0], b[0])*compare_vec4(a[1], b[1])*compare_vec4(a[2], b[2])*compare_vec4(a[3], b[3]); }\nmediump float compare_int      (highp int a, highp int b)      { return a == b ? 1.0 : 0.0; }\nmediump float compare_ivec2    (highp ivec2 a, highp ivec2..." /* TRUNCATED STRING LITERAL */
             ,0xbd0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3f0,
             "\nvoid main (void)\n{\n    gl_Position = a_position;\n    mediump float result = 1.0;\n"
             ,0x52);
  ub::anon_unknown_1::generateCompareSrc
            ((ostringstream *)local_3f0,(char *)this_00,(ShaderInterface *)&local_6c8,
             (UniformLayout *)local_420,
             (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> *)
             &DAT_00000001,SUB81(in_R9,0));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3f0,"    v_vtxResult = result;\n}\n",0x1c);
  if (local_668 != (undefined1  [8])0x0) {
    operator_delete((void *)local_668,local_658._0_8_ - (long)local_668);
  }
  pcVar25 = glu::getGLSLVersionDeclaration(local_7d0->m_glslVersion);
  if (pcVar25 == (char *)0x0) {
    std::ios::clear((int)local_7e8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x640);
  }
  else {
    sVar26 = strlen(pcVar25);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar25,sVar26);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"in mediump float v_vtxResult;\n",0x1e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) out mediump vec4 dEQP_FragColor;\n",0x36);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  local_668 = (undefined1  [8])0x0;
  auStack_660 = (undefined1  [8])0x0;
  local_658._0_8_ = 0;
  ub::ShaderInterface::getNamedStructs
            (this_00,(vector<const_deqp::ub::StructType_*,_std::allocator<const_deqp::ub::StructType_*>_>
                      *)local_668);
  if (local_668 != auStack_660) {
    auVar43 = local_668;
    do {
      ub::anon_unknown_1::generateFullDeclaration
                ((ostringstream *)local_1a8,(StructType *)((TestLog *)auVar43)->m_log,0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n",2);
      auVar43 = (undefined1  [8])((long)auVar43 + 8);
    } while (auVar43 != auStack_660);
  }
  isVertex = (undefined1)in_R9;
  ppUVar27 = (local_7d0->m_interface).m_uniformBlocks.
             super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppUVar34 = (local_7d0->m_interface).m_uniformBlocks.
             super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppUVar34 - (long)ppUVar27) >> 3)) {
    lVar39 = 0;
    do {
      if ((ppUVar27[lVar39]->m_flags & 0x200) != 0) {
        ub::anon_unknown_1::generateDeclaration((ostringstream *)local_1a8,ppUVar27[lVar39]);
        ppUVar27 = (local_7d0->m_interface).m_uniformBlocks.
                   super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppUVar34 = (local_7d0->m_interface).m_uniformBlocks.
                   super__Vector_base<deqp::ub::UniformBlock_*,_std::allocator<deqp::ub::UniformBlock_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      }
      isVertex = (undefined1)in_R9;
      lVar39 = lVar39 + 1;
    } while (lVar39 < (int)((ulong)((long)ppUVar34 - (long)ppUVar27) >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "mediump float compare_float    (highp float a, highp float b)  { return abs(a - b) < 0.05 ? 1.0 : 0.0; }\nmediump float compare_vec2     (highp vec2 a, highp vec2 b)    { return compare_float(a.x, b.x)*compare_float(a.y, b.y); }\nmediump float compare_vec3     (highp vec3 a, highp vec3 b)    { return compare_float(a.x, b.x)*compare_float(a.y, b.y)*compare_float(a.z, b.z); }\nmediump float compare_vec4     (highp vec4 a, highp vec4 b)    { return compare_float(a.x, b.x)*compare_float(a.y, b.y)*compare_float(a.z, b.z)*compare_float(a.w, b.w); }\nmediump float compare_mat2     (highp mat2 a, highp mat2 b)    { return compare_vec2(a[0], b[0])*compare_vec2(a[1], b[1]); }\nmediump float compare_mat2x3   (highp mat2x3 a, highp mat2x3 b){ return compare_vec3(a[0], b[0])*compare_vec3(a[1], b[1]); }\nmediump float compare_mat2x4   (highp mat2x4 a, highp mat2x4 b){ return compare_vec4(a[0], b[0])*compare_vec4(a[1], b[1]); }\nmediump float compare_mat3x2   (highp mat3x2 a, highp mat3x2 b){ return compare_vec2(a[0], b[0])*compare_vec2(a[1], b[1])*compare_vec2(a[2], b[2]); }\nmediump float compare_mat3     (highp mat3 a, highp mat3 b)    { return compare_vec3(a[0], b[0])*compare_vec3(a[1], b[1])*compare_vec3(a[2], b[2]); }\nmediump float compare_mat3x4   (highp mat3x4 a, highp mat3x4 b){ return compare_vec4(a[0], b[0])*compare_vec4(a[1], b[1])*compare_vec4(a[2], b[2]); }\nmediump float compare_mat4x2   (highp mat4x2 a, highp mat4x2 b){ return compare_vec2(a[0], b[0])*compare_vec2(a[1], b[1])*compare_vec2(a[2], b[2])*compare_vec2(a[3], b[3]); }\nmediump float compare_mat4x3   (highp mat4x3 a, highp mat4x3 b){ return compare_vec3(a[0], b[0])*compare_vec3(a[1], b[1])*compare_vec3(a[2], b[2])*compare_vec3(a[3], b[3]); }\nmediump float compare_mat4     (highp mat4 a, highp mat4 b)    { return compare_vec4(a[0], b[0])*compare_vec4(a[1], b[1])*compare_vec4(a[2], b[2])*compare_vec4(a[3], b[3]); }\nmediump float compare_int      (highp int a, highp int b)      { return a == b ? 1.0 : 0.0; }\nmediump float compare_ivec2    (highp ivec2 a, highp ivec2..." /* TRUNCATED STRING LITERAL */
             ,0xbd0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\nvoid main (void)\n{\n    mediump float result = 1.0;\n",0x34);
  ub::anon_unknown_1::generateCompareSrc
            ((ostringstream *)local_1a8,(char *)this_00,(ShaderInterface *)&local_6c8,
             (UniformLayout *)local_420,
             (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> *)0x0
             ,(bool)isVertex);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    dEQP_FragColor = vec4(1.0, v_vtxResult, result, 1.0);\n}\n",
             0x3c);
  if (local_668 != (undefined1  [8])0x0) {
    operator_delete((void *)local_668,local_658._0_8_ - (long)local_668);
  }
  renderCtx = ((local_7d0->super_TestCase).m_context)->m_renderCtx;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_758,(char *)local_7b8._0_8_,(allocator<char> *)&local_6f0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_780,
             (char *)CONCAT44(local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              (uint)local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start),(allocator<char> *)&local_4b8)
  ;
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_668,0,0xac);
  local_5b8._0_8_ = (pointer)0x0;
  local_5b8[8] = 0;
  local_5b8._9_7_ = 0;
  local_5b8[0x10] = 0;
  local_5b8._17_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_668,(value_type *)local_758);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_658 + 8),&local_780);
  glu::ShaderProgram::ShaderProgram(&local_278,renderCtx,(ProgramSources *)local_668);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_5b8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_5d8);
  lVar39 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_668 + lVar39));
    lVar39 = lVar39 + -0x18;
  } while (lVar39 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_780._M_dataplus._M_p != &local_780.field_2) {
    operator_delete(local_780._M_dataplus._M_p,local_780.field_2._M_allocated_capacity + 1);
  }
  lVar39 = local_7c8;
  if ((pointer *)
      CONCAT44(local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start._4_4_,
               (uint)local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start) !=
      &local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage) {
    operator_delete((undefined1 *)
                    CONCAT44(local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,
                             (uint)local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start),
                    (long)local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  if ((undefined1 *)local_758._0_8_ != local_758 + 0x10) {
    operator_delete((void *)local_758._0_8_,local_758._16_8_ + 1);
  }
  if ((undefined1 *)local_7b8._0_8_ != local_7b8 + 0x10) {
    operator_delete((void *)local_7b8._0_8_,(ulong)(local_7b8._16_8_ + 1));
  }
  glu::operator<<(local_720,&local_278);
  dVar15 = local_278.m_program.m_program;
  if (local_278.m_program.m_info.linkOk == false) {
    tcu::TestContext::setTestResult
              ((local_7d0->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Compile failed");
  }
  else {
    vStack_740.
    super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_740.
    super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_758._16_8_ = 0;
    vStack_740.
    super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_758._0_8_ = (pointer)0x0;
    local_758._8_8_ = (pointer)0x0;
    local_7d4 = 0;
    local_75c = 0;
    (**(code **)(lVar39 + 0x9d8))(local_278.m_program.m_program,0x8b86);
    (**(code **)(lVar39 + 0x9d8))(dVar15,0x8a36,&local_75c);
    dVar17 = (**(code **)(lVar39 + 0x800))();
    glu::checkError(dVar17,"Failed to get number of uniforms and uniform blocks",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcUniformBlockCase.cpp"
                    ,0x45b);
    std::vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>::resize
              ((vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_> *)
               local_758,(long)local_75c);
    if (0 < local_75c) {
      lVar39 = 0x28;
      uVar37 = 0;
      do {
        uVar10 = local_758._0_8_;
        lVar42 = local_7c8;
        (**(code **)(local_7c8 + 0x760))(dVar15,uVar37 & 0xffffffff,0x8a40,&local_780);
        (**(code **)(lVar42 + 0x760))(dVar15,uVar37 & 0xffffffff,0x8a41,&local_718);
        (**(code **)(lVar42 + 0x760))(dVar15,uVar37 & 0xffffffff,0x8a42,&local_6f0);
        dVar17 = (**(code **)(lVar42 + 0x800))();
        glu::checkError(dVar17,"Uniform block query failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcUniformBlockCase.cpp"
                        ,0x46a);
        uVar40 = (uint)local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
        if ((int)(uint)local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start < 2) {
          uVar40 = 1;
        }
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)local_7b8,(ulong)uVar40,
                   (allocator_type *)local_668);
        (**(code **)(local_7c8 + 0x758))
                  (dVar15,uVar37 & 0xffffffff,local_7b8._8_4_ - (int)local_7b8._0_8_,0);
        uVar9 = local_7b8._0_8_;
        local_668 = (undefined1  [8])(auStack_660 + 8);
        if ((pointer)local_7b8._0_8_ == (pointer)0x0) {
          pcVar25 = &DAT_00000001;
        }
        else {
          sVar26 = strlen((char *)local_7b8._0_8_);
          pcVar25 = (char *)(uVar9 + sVar26);
        }
        std::__cxx11::string::_M_construct<char_const*>((string *)local_668,uVar9,pcVar25);
        std::__cxx11::string::operator=((string *)(uVar10 + lVar39 + -0x28),(string *)local_668);
        if (local_668 != (undefined1  [8])(auStack_660 + 8)) {
          operator_delete((void *)local_668,local_658._0_8_ + 1);
        }
        *(undefined4 *)(uVar10 + lVar39 + -8) = local_780._M_dataplus._M_p._0_4_;
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)(uVar10 + lVar39),
                   (long)(int)local_6f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
        if (0 < (int)local_6f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start) {
          (**(code **)(local_7c8 + 0x760))
                    (dVar15,uVar37 & 0xffffffff,0x8a43,
                     (((vector<int,_std::allocator<int>_> *)(uVar10 + lVar39))->
                     super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                     _M_start);
        }
        dVar17 = (**(code **)(local_7c8 + 0x800))();
        glu::checkError(dVar17,"Uniform block query failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcUniformBlockCase.cpp"
                        ,0x478);
        if ((pointer)local_7b8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_7b8._0_8_,local_7b8._16_8_ - local_7b8._0_8_);
        }
        uVar37 = uVar37 + 1;
        lVar39 = lVar39 + 0x40;
      } while ((long)uVar37 < (long)local_75c);
    }
    lVar39 = local_7c8;
    if (0 < (long)local_7d4) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7b8,(long)local_7d4,
                 (allocator_type *)local_668);
      if (0 < local_7d4) {
        lVar42 = 0;
        do {
          *(int *)(local_7b8._0_8_ + lVar42 * 4) = (int)lVar42;
          lVar42 = lVar42 + 1;
        } while (lVar42 < local_7d4);
      }
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_780,(long)local_7d4,
                 (allocator_type *)local_668);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_718,(long)local_7d4,(allocator_type *)local_668);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_6f0,(long)local_7d4,(allocator_type *)local_668);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_4b8,(long)local_7d4,(allocator_type *)local_668);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_458,(long)local_7d4,(allocator_type *)local_668);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_470,(long)local_7d4,(allocator_type *)local_668);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_488,(long)local_7d4,(allocator_type *)local_668);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_4a0,(long)local_7d4,(allocator_type *)local_668);
      (**(code **)(lVar39 + 0x770))
                (dVar15,(ulong)(CONCAT44(local_7b8._12_4_,local_7b8._8_4_) - local_7b8._0_8_) >> 2,
                 local_7b8._0_8_,0x8a37,local_780._M_dataplus._M_p);
      (**(code **)(lVar39 + 0x770))
                (dVar15,(ulong)(CONCAT44(local_7b8._12_4_,local_7b8._8_4_) - local_7b8._0_8_) >> 2,
                 local_7b8._0_8_,0x8a38,
                 CONCAT44(local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          (uint)local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start));
      (**(code **)(lVar39 + 0x770))
                (dVar15,(ulong)(CONCAT44(local_7b8._12_4_,local_7b8._8_4_) - local_7b8._0_8_) >> 2,
                 local_7b8._0_8_,0x8a39,
                 CONCAT44(local_6f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          (int)local_6f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start));
      (**(code **)(lVar39 + 0x770))
                (dVar15,(ulong)(CONCAT44(local_7b8._12_4_,local_7b8._8_4_) - local_7b8._0_8_) >> 2,
                 local_7b8._0_8_,0x8a3a,
                 local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      (**(code **)(lVar39 + 0x770))
                (dVar15,(ulong)(CONCAT44(local_7b8._12_4_,local_7b8._8_4_) - local_7b8._0_8_) >> 2,
                 local_7b8._0_8_,0x8a3b,
                 local_458.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      (**(code **)(lVar39 + 0x770))
                (dVar15,(ulong)(CONCAT44(local_7b8._12_4_,local_7b8._8_4_) - local_7b8._0_8_) >> 2,
                 local_7b8._0_8_,0x8a3c,
                 local_470.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      (**(code **)(lVar39 + 0x770))
                (dVar15,(ulong)(CONCAT44(local_7b8._12_4_,local_7b8._8_4_) - local_7b8._0_8_) >> 2,
                 local_7b8._0_8_,0x8a3d,
                 local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      (**(code **)(lVar39 + 0x770))
                (dVar15,(ulong)(CONCAT44(local_7b8._12_4_,local_7b8._8_4_) - local_7b8._0_8_) >> 2,
                 local_7b8._0_8_,0x8a3e,
                 local_4a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      dVar17 = (**(code **)(lVar39 + 0x800))();
      glu::checkError(dVar17,"Active uniform query failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcUniformBlockCase.cpp"
                      ,0x49d);
      std::vector<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>::
      resize(&vStack_740,(long)local_7d4);
      if (0 < local_7d4) {
        lVar39 = 0;
        uVar37 = 0;
        do {
          pUVar41 = vStack_740.
                    super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          std::vector<char,_std::allocator<char>_>::vector
                    (&local_4d0,
                     (long)*(int *)(CONCAT44(local_6f0.super__Vector_base<int,_std::allocator<int>_>
                                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                             (int)local_6f0.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) +
                                   uVar37 * 4),(allocator_type *)local_668);
          local_6cc = 0;
          local_6d0 = 0;
          local_6d4 = 0;
          local_7e8[0] = local_4d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start;
          (**(code **)(local_7c8 + 0x750))
                    (dVar15,uVar37 & 0xffffffff,
                     (int)local_4d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                     (int)local_4d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,&local_6cc,&local_6d0,&local_6d4);
          dVar17 = (**(code **)(local_7c8 + 0x800))();
          glu::checkError(dVar17,"Uniform name query failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcUniformBlockCase.cpp"
                          ,0x4ac);
          pcVar12 = local_4d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (((local_6cc + 1 !=
                *(int *)(CONCAT44(local_6f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  (int)local_6f0.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start) + uVar37 * 4)) ||
              (local_6d0 !=
               *(int *)(CONCAT44(local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start._4_4_,
                                 (uint)local_718.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start) + uVar37 * 4))) ||
             (local_6d4 != *(int *)(local_780._M_dataplus._M_p + uVar37 * 4))) {
            this_01 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_01,
                       "Values returned by glGetActiveUniform() don\'t match with values queried with glGetActiveUniformsiv()."
                       ,(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcUniformBlockCase.cpp"
                       ,0x4b2);
            __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          local_668 = (undefined1  [8])(auStack_660 + 8);
          if (local_4d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start == (char *)0x0) {
            pcVar25 = &DAT_00000001;
          }
          else {
            sVar26 = strlen(local_4d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
            pcVar25 = pcVar12 + sVar26;
          }
          std::__cxx11::string::_M_construct<char_const*>((string *)local_668,pcVar12,pcVar25);
          std::__cxx11::string::operator=((string *)((long)pUVar41 + lVar39),(string *)local_668);
          if (local_668 != (undefined1  [8])(auStack_660 + 8)) {
            operator_delete((void *)local_668,local_658._0_8_ + 1);
          }
          DVar18 = glu::getDataTypeFromGLType
                             (*(deUint32 *)(local_780._M_dataplus._M_p + uVar37 * 4));
          *(DataType *)((long)pUVar41 + 0x20 + lVar39) = DVar18;
          *(undefined4 *)((long)pUVar41 + 0x24 + lVar39) =
               *(undefined4 *)
                (CONCAT44(local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          (uint)local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start) + uVar37 * 4);
          *(int *)((long)pUVar41 + 0x28 + lVar39) =
               local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar37];
          *(int *)((long)pUVar41 + 0x2c + lVar39) =
               local_458.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar37];
          *(int *)((long)pUVar41 + 0x30 + lVar39) =
               local_470.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar37];
          *(int *)((long)pUVar41 + 0x34 + lVar39) =
               local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar37];
          *(bool *)((long)pUVar41 + 0x38 + lVar39) =
               local_4a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar37] != 0;
          if (local_4d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != (char *)0x0) {
            operator_delete(local_4d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_4d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_4d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          uVar37 = uVar37 + 1;
          lVar39 = lVar39 + 0x40;
        } while ((long)uVar37 < (long)local_7d4);
      }
      if (local_4a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_4a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_4a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_4a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_470.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_470.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_470.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_470.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_458.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_458.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_458.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_458.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_4b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      pvVar7 = (void *)CONCAT44(local_6f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                (int)local_6f0.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start);
      if (pvVar7 != (void *)0x0) {
        operator_delete(pvVar7,(long)local_6f0.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_end_of_storage - (long)pvVar7);
      }
      pvVar7 = (void *)CONCAT44(local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                (uint)local_718.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
      if (pvVar7 != (void *)0x0) {
        operator_delete(pvVar7,(long)local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_end_of_storage - (long)pvVar7);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_780._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_780._M_dataplus._M_p,
                        local_780.field_2._M_allocated_capacity - (long)local_780._M_dataplus._M_p);
      }
      if ((pointer)local_7b8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_7b8._0_8_,local_7b8._16_8_ - local_7b8._0_8_);
      }
    }
    local_7b8._0_8_ = local_7b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_7b8,"ActiveUniformBlocks","");
    local_780._M_dataplus._M_p = (pointer)&local_780.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_780,"Active Uniform Blocks","")
    ;
    tcu::LogSection::LogSection((LogSection *)local_668,(string *)local_7b8,&local_780);
    tcu::TestLog::startSection(local_720,(char *)local_668,local_648._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_648._M_p != aaStack_638) {
      operator_delete(local_648._M_p,(ulong)(aaStack_638[0]._M_allocated_capacity + 1));
    }
    if (local_668 != (undefined1  [8])(auStack_660 + 8)) {
      operator_delete((void *)local_668,local_658._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_780._M_dataplus._M_p != &local_780.field_2) {
      operator_delete(local_780._M_dataplus._M_p,local_780.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_7b8._0_8_ != local_7b8 + 0x10) {
      operator_delete((void *)local_7b8._0_8_,(ulong)(local_7b8._16_8_ + 1));
    }
    if (0 < (int)((ulong)(local_758._8_8_ - local_758._0_8_) >> 6)) {
      lVar39 = 0;
      lVar42 = 0;
      do {
        local_668 = (undefined1  [8])local_720;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_660);
        std::ostream::operator<<((ostringstream *)auStack_660,(int)lVar42);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_660,": ",2);
        ub::operator<<((ostream *)auStack_660,(BlockLayoutEntry *)(local_758._0_8_ + lVar39));
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_668,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_660);
        std::ios_base::~ios_base(local_5f0);
        lVar42 = lVar42 + 1;
        lVar39 = lVar39 + 0x40;
      } while (lVar42 < (int)((ulong)(local_758._8_8_ - local_758._0_8_) >> 6));
    }
    tcu::TestLog::endSection(local_720);
    local_7b8._0_8_ = local_7b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_7b8,"ActiveUniforms","");
    local_780._M_dataplus._M_p = (pointer)&local_780.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_780,"Active Uniforms","");
    tcu::LogSection::LogSection((LogSection *)local_668,(string *)local_7b8,&local_780);
    tcu::TestLog::startSection(local_720,(char *)local_668,local_648._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_648._M_p != aaStack_638) {
      operator_delete(local_648._M_p,(ulong)(aaStack_638[0]._M_allocated_capacity + 1));
    }
    if (local_668 != (undefined1  [8])(auStack_660 + 8)) {
      operator_delete((void *)local_668,local_658._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_780._M_dataplus._M_p != &local_780.field_2) {
      operator_delete(local_780._M_dataplus._M_p,local_780.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_7b8._0_8_ != local_7b8 + 0x10) {
      operator_delete((void *)local_7b8._0_8_,(ulong)(local_7b8._16_8_ + 1));
    }
    if (0 < (int)((ulong)((long)vStack_740.
                                super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)vStack_740.
                               super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 6)) {
      lVar39 = 0;
      lVar42 = 0;
      do {
        local_668 = (undefined1  [8])local_720;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_660);
        std::ostream::operator<<((ostringstream *)auStack_660,(int)lVar42);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_660,": ",2);
        ub::operator<<((ostream *)auStack_660,
                       (UniformLayoutEntry *)
                       ((long)vStack_740.
                              super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar39));
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_668,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_660);
        std::ios_base::~ios_base(local_5f0);
        lVar42 = lVar42 + 1;
        lVar39 = lVar39 + 0x40;
      } while (lVar42 < (int)((ulong)((long)vStack_740.
                                            super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)vStack_740.
                                           super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 6));
    }
    tcu::TestLog::endSection(local_720);
    lVar39 = local_7c8;
    bVar45 = checkLayoutIndices(local_7d0,(UniformLayout *)local_758);
    if (((bVar45) && (bVar45 = checkLayoutBounds(local_7d0,(UniformLayout *)local_758), bVar45)) &&
       (bVar45 = compareTypes(local_7d0,&local_6c8,(UniformLayout *)local_758), bVar45)) {
      bVar45 = compareStd140Blocks(local_7d0,&local_6c8,(UniformLayout *)local_758);
      if (!bVar45) {
        tcu::TestContext::setTestResult
                  ((local_7d0->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Invalid std140 layout");
      }
      bVar45 = compareSharedBlocks(local_7d0,&local_6c8,(UniformLayout *)local_758);
      if (!bVar45) {
        tcu::TestContext::setTestResult
                  ((local_7d0->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Invalid shared layout");
      }
      bVar45 = checkIndexQueries(local_7d0,local_278.m_program.m_program,(UniformLayout *)local_758)
      ;
      if (!bVar45) {
        tcu::TestContext::setTestResult
                  ((local_7d0->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Inconsintent block index query results");
      }
      (**(code **)(lVar39 + 0x1680))(local_278.m_program.m_program);
      if (0 < (int)((ulong)(local_758._8_8_ - local_758._0_8_) >> 6)) {
        iVar13 = 0;
        do {
          (**(code **)(local_7c8 + 0x15d0))(local_278.m_program.m_program,iVar13,iVar13);
          iVar13 = iVar13 + 1;
        } while (iVar13 < (int)((ulong)(local_758._8_8_ - local_758._0_8_) >> 6));
      }
      dVar15 = (**(code **)(local_7c8 + 0x800))();
      glu::checkError(dVar15,"Failed to set uniform block bindings",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcUniformBlockCase.cpp"
                      ,0x5a2);
      pCVar3 = (local_7d0->super_TestCase).m_context;
      local_780._M_dataplus._M_p = (pointer)pCVar3->m_renderCtx;
      local_780._M_string_length = 0;
      local_780.field_2._M_allocated_capacity = 0;
      local_780.field_2._8_8_ = 0;
      uVar40 = (uint)((ulong)(local_758._8_8_ - local_758._0_8_) >> 6);
      if (local_7d0->m_bufferMode == BUFFERMODE_PER_BLOCK) {
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)local_7b8,(long)(int)uVar40,(allocator_type *)local_668);
        local_658._8_8_ = auStack_660;
        auStack_660 = (undefined1  [8])((ulong)auStack_660 & 0xffffffff00000000);
        local_658._0_8_ = 0;
        local_640 = (pointer)0x0;
        local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = 0;
        local_648._M_p = (pointer)local_658._8_8_;
        if (0 < (int)uVar40) {
          do {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       (local_7b8._0_8_ +
                       (long)(int)(uint)local_718.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start * 0x18),
                       (long)*(int *)(local_758._0_8_ +
                                     (long)(int)(uint)local_718.
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl.super__Vector_impl_data._M_start *
                                     0x40 + 0x20));
            pvVar4 = *(mapped_type *)
                      (local_7b8._0_8_ +
                      (long)(int)(uint)local_718.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start * 0x18);
            ppvVar22 = std::
                       map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                       ::operator[]((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                                     *)local_668,(key_type_conflict *)&local_718);
            *ppvVar22 = pvVar4;
            local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start._0_4_ =
                 (uint)local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + 1;
          } while ((int)(uint)local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start < (int)uVar40);
        }
        ub::anon_unknown_1::copyUniformData
                  ((UniformLayout *)local_758,
                   (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                    *)local_668,&local_6c8,
                   (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                    *)local_420);
        if (0 < (int)uVar40) {
          lVar39 = 8;
          uVar37 = 0;
          do {
            dVar15 = ub::UniformBufferManager::allocBuffer((UniformBufferManager *)&local_780);
            (**(code **)(local_7c8 + 0x40))(0x8a11,dVar15);
            (**(code **)(local_7c8 + 0x150))
                      (0x8a11,*(long *)(local_7b8._0_8_ + lVar39) -
                              *(long *)(local_7b8._0_8_ + lVar39 + -8),
                       *(long *)(local_7b8._0_8_ + lVar39 + -8),0x88e4);
            dVar17 = (**(code **)(local_7c8 + 0x800))();
            glu::checkError(dVar17,"Failed to upload uniform buffer data",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcUniformBlockCase.cpp"
                            ,0x5bc);
            (**(code **)(local_7c8 + 0x48))(0x8a11,uVar37 & 0xffffffff,dVar15);
            dVar15 = (**(code **)(local_7c8 + 0x800))();
            glu::checkError(dVar15,"glBindBufferBase(GL_UNIFORM_BUFFER) failed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcUniformBlockCase.cpp"
                            ,0x5bf);
            uVar37 = uVar37 + 1;
            lVar39 = lVar39 + 0x18;
          } while ((uVar40 & 0x7fffffff) != uVar37);
        }
        std::
        _Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
        ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                     *)local_668);
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)local_7b8);
      }
      else {
        pCVar5 = pCVar3->m_contextInfo;
        iVar13 = (*pCVar5->_vptr_ContextInfo[2])(pCVar5,0x8a34);
        local_658._8_8_ = auStack_660;
        uVar37 = 0;
        auStack_660 = (undefined1  [8])((ulong)auStack_660 & 0xffffffff00000000);
        local_658._0_8_ = 0;
        local_640 = (pointer)0x0;
        local_7b8._0_8_ = local_7b8._0_8_ & 0xffffffff00000000;
        local_648._M_p = (pointer)local_658._8_8_;
        if (0 < (int)uVar40) {
          do {
            iVar30 = (int)uVar37;
            if ((0 < iVar13) && ((iVar30 / iVar13) * iVar13 != iVar30)) {
              iVar30 = (iVar30 / iVar13 + 1) * iVar13;
            }
            pmVar28 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)local_668,(key_type_conflict *)local_7b8);
            *pmVar28 = iVar30;
            lVar39 = (long)(int)local_7b8._0_4_;
            iVar31 = local_7b8._0_4_ + 1;
            uVar37 = (ulong)(uint)(iVar30 + *(int *)(local_758._0_8_ + lVar39 * 0x40 + 0x20));
            local_7b8._0_4_ = iVar31;
          } while (iVar31 < (int)uVar40);
          uVar37 = (ulong)(iVar30 + *(int *)(local_758._0_8_ + lVar39 * 0x40 + 0x20));
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_718,uVar37,
                   (allocator_type *)local_7b8);
        local_7b8._24_8_ = local_7b8 + 8;
        local_7b8._8_4_ = _S_red;
        local_7b8._16_8_ = (pointer)0x0;
        local_790 = 0;
        local_6f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = 0;
        local_798 = (_Base_ptr)local_7b8._24_8_;
        if (0 < (int)uVar40) {
          do {
            pmVar28 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)local_668,(key_type_conflict *)&local_6f0);
            iVar13 = *pmVar28;
            lVar39 = CONCAT44(local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              (uint)local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            ppvVar22 = std::
                       map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                       ::operator[]((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                                     *)local_7b8,(key_type_conflict *)&local_6f0);
            *ppvVar22 = (mapped_type)(lVar39 + iVar13);
            local_6f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start._0_4_ =
                 (int)local_6f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + 1;
          } while ((int)local_6f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start < (int)uVar40);
        }
        ub::anon_unknown_1::copyUniformData
                  ((UniformLayout *)local_758,
                   (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                    *)local_7b8,&local_6c8,
                   (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                    *)local_420);
        dVar15 = ub::UniformBufferManager::allocBuffer((UniformBufferManager *)&local_780);
        (**(code **)(local_7c8 + 0x40))(0x8a11,dVar15);
        piVar8 = (pointer)CONCAT44(local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,
                                   (uint)local_718.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start);
        if (piVar8 != local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
          (**(code **)(local_7c8 + 0x150))
                    (0x8a11,(long)local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)piVar8,piVar8,0x88e4);
        }
        dVar17 = (**(code **)(local_7c8 + 0x800))();
        glu::checkError(dVar17,"Failed to upload uniform buffer data",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcUniformBlockCase.cpp"
                        ,0x5e7);
        local_6f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = 0;
        if (0 < (int)uVar40) {
          do {
            iVar13 = (int)local_6f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
            pcVar6 = *(code **)(local_7c8 + 0x50);
            pmVar28 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)local_668,(key_type_conflict *)&local_6f0);
            (*pcVar6)(0x8a11,iVar13,dVar15,(long)*pmVar28,
                      (long)*(int *)(local_758._0_8_ +
                                    (long)(int)local_6f0.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start * 0x40 + 0x20));
            dVar17 = (**(code **)(local_7c8 + 0x800))();
            glu::checkError(dVar17,"glBindBufferRange(GL_UNIFORM_BUFFER) failed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcUniformBlockCase.cpp"
                            ,0x5f0);
            local_6f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start._0_4_ =
                 (int)local_6f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + 1;
          } while ((int)local_6f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start < (int)uVar40);
        }
        std::
        _Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
        ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                     *)local_7b8);
        pvVar7 = (void *)CONCAT44(local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  (uint)local_718.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
        if (pvVar7 != (void *)0x0) {
          operator_delete(pvVar7,(long)local_718.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pvVar7);
        }
        std::
        _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
        ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     *)local_668);
      }
      bVar45 = render(local_7d0,&local_278);
      if (!bVar45) {
        tcu::TestContext::setTestResult
                  ((local_7d0->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Image compare failed");
      }
      ub::UniformBufferManager::~UniformBufferManager((UniformBufferManager *)&local_780);
    }
    else {
      tcu::TestContext::setTestResult
                ((local_7d0->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_FAIL,"Invalid layout");
    }
    std::vector<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>::
    ~vector(&vStack_740);
    std::vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>::~vector
              ((vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_> *)
               local_758);
  }
  glu::ShaderProgram::~ShaderProgram(&local_278);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
  std::ios_base::~ios_base(local_380);
  std::
  _Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
               *)local_420);
  if (local_4e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_4e8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_4e8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>::~vector
            (&local_6c8.uniforms);
  std::vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>::~vector
            (&local_6c8.blocks);
  return STOP;
}

Assistant:

UniformBlockCase::IterateResult UniformBlockCase::iterate(void)
{
	TestLog&			  log = m_testCtx.getLog();
	const glw::Functions& gl  = m_context.getRenderContext().getFunctions();
	UniformLayout		  refLayout; //!< std140 layout.
	vector<deUint8>		  data;		 //!< Data.
	map<int, void*> blockPointers;   //!< Reference block pointers.

	// Initialize result to pass.
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	// Compute reference layout.
	computeStd140Layout(refLayout, m_interface);

	// Assign storage for reference values.
	{
		int totalSize = 0;
		for (vector<BlockLayoutEntry>::const_iterator blockIter = refLayout.blocks.begin();
			 blockIter != refLayout.blocks.end(); blockIter++)
			totalSize += blockIter->size;
		data.resize(totalSize);

		// Pointers for each block.
		int curOffset = 0;
		for (int blockNdx = 0; blockNdx < (int)refLayout.blocks.size(); blockNdx++)
		{
			blockPointers[blockNdx] = &data[0] + curOffset;
			curOffset += refLayout.blocks[blockNdx].size;
		}
	}

	// Generate values.
	generateValues(refLayout, blockPointers, 1 /* seed */);

	// Generate shaders and build program.
	std::ostringstream vtxSrc;
	std::ostringstream fragSrc;

	generateVertexShader(vtxSrc, m_glslVersion, m_interface, refLayout, blockPointers);
	generateFragmentShader(fragSrc, m_glslVersion, m_interface, refLayout, blockPointers);

	glu::ShaderProgram program(m_context.getRenderContext(),
							   glu::makeVtxFragSources(vtxSrc.str().c_str(), fragSrc.str().c_str()));
	log << program;

	if (!program.isOk())
	{
		// Compile failed.
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compile failed");
		return STOP;
	}

	// Query layout from GL.
	UniformLayout glLayout;
	getGLUniformLayout(gl, glLayout, program.getProgram());

	// Print layout to log.
	log << TestLog::Section("ActiveUniformBlocks", "Active Uniform Blocks");
	for (int blockNdx = 0; blockNdx < (int)glLayout.blocks.size(); blockNdx++)
		log << TestLog::Message << blockNdx << ": " << glLayout.blocks[blockNdx] << TestLog::EndMessage;
	log << TestLog::EndSection;

	log << TestLog::Section("ActiveUniforms", "Active Uniforms");
	for (int uniformNdx = 0; uniformNdx < (int)glLayout.uniforms.size(); uniformNdx++)
		log << TestLog::Message << uniformNdx << ": " << glLayout.uniforms[uniformNdx] << TestLog::EndMessage;
	log << TestLog::EndSection;

	// Check that we can even try rendering with given layout.
	if (!checkLayoutIndices(glLayout) || !checkLayoutBounds(glLayout) || !compareTypes(refLayout, glLayout))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid layout");
		return STOP; // It is not safe to use the given layout.
	}

	// Verify all std140 blocks.
	if (!compareStd140Blocks(refLayout, glLayout))
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid std140 layout");

	// Verify all shared blocks - all uniforms should be active, and certain properties match.
	if (!compareSharedBlocks(refLayout, glLayout))
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid shared layout");

	// Check consistency with index queries
	if (!checkIndexQueries(program.getProgram(), glLayout))
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Inconsintent block index query results");

	// Use program.
	gl.useProgram(program.getProgram());

	// Assign binding points to all active uniform blocks.
	for (int blockNdx = 0; blockNdx < (int)glLayout.blocks.size(); blockNdx++)
	{
		deUint32 binding = (deUint32)blockNdx; // \todo [2012-01-25 pyry] Randomize order?
		gl.uniformBlockBinding(program.getProgram(), (deUint32)blockNdx, binding);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to set uniform block bindings");

	// Allocate buffers, write data and bind to targets.
	UniformBufferManager bufferManager(m_context.getRenderContext());
	if (m_bufferMode == BUFFERMODE_PER_BLOCK)
	{
		int						 numBlocks = (int)glLayout.blocks.size();
		vector<vector<deUint8> > glData(numBlocks);
		map<int, void*> glBlockPointers;

		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			glData[blockNdx].resize(glLayout.blocks[blockNdx].size);
			glBlockPointers[blockNdx] = &glData[blockNdx][0];
		}

		copyUniformData(glLayout, glBlockPointers, refLayout, blockPointers);

		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			deUint32 buffer  = bufferManager.allocBuffer();
			deUint32 binding = (deUint32)blockNdx;

			gl.bindBuffer(GL_UNIFORM_BUFFER, buffer);
			gl.bufferData(GL_UNIFORM_BUFFER, (glw::GLsizeiptr)glData[blockNdx].size(), &glData[blockNdx][0],
						  GL_STATIC_DRAW);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to upload uniform buffer data");

			gl.bindBufferBase(GL_UNIFORM_BUFFER, binding, buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase(GL_UNIFORM_BUFFER) failed");
		}
	}
	else
	{
		DE_ASSERT(m_bufferMode == BUFFERMODE_SINGLE);

		int totalSize		 = 0;
		int curOffset		 = 0;
		int numBlocks		 = (int)glLayout.blocks.size();
		int bindingAlignment = m_context.getContextInfo().getInt(GL_UNIFORM_BUFFER_OFFSET_ALIGNMENT);
		map<int, int> glBlockOffsets;

		// Compute total size and offsets.
		curOffset = 0;
		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			if (bindingAlignment > 0)
				curOffset			 = deRoundUp32(curOffset, bindingAlignment);
			glBlockOffsets[blockNdx] = curOffset;
			curOffset += glLayout.blocks[blockNdx].size;
		}
		totalSize = curOffset;

		// Assign block pointers.
		vector<deUint8> glData(totalSize);
		map<int, void*> glBlockPointers;

		for (int blockNdx			  = 0; blockNdx < numBlocks; blockNdx++)
			glBlockPointers[blockNdx] = &glData[glBlockOffsets[blockNdx]];

		// Copy to gl format.
		copyUniformData(glLayout, glBlockPointers, refLayout, blockPointers);

		// Allocate buffer and upload data.
		deUint32 buffer = bufferManager.allocBuffer();
		gl.bindBuffer(GL_UNIFORM_BUFFER, buffer);
		if (!glData.empty())
			gl.bufferData(GL_UNIFORM_BUFFER, (glw::GLsizeiptr)glData.size(), &glData[0], GL_STATIC_DRAW);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to upload uniform buffer data");

		// Bind ranges to binding points.
		curOffset = 0;
		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			deUint32 binding = (deUint32)blockNdx;
			gl.bindBufferRange(GL_UNIFORM_BUFFER, binding, buffer, (glw::GLintptr)glBlockOffsets[blockNdx],
							   (glw::GLsizeiptr)glLayout.blocks[blockNdx].size);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferRange(GL_UNIFORM_BUFFER) failed");
			curOffset += glLayout.blocks[blockNdx].size;
		}
	}

	bool renderOk = render(program);
	if (!renderOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image compare failed");

	return STOP;
}